

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rewind.c
# Opt level: O1

Ticks rewind_get_newest_ticks(RewindBuffer *buffer)

{
  Ticks *pTVar1;
  long lVar2;
  
  lVar2 = 0;
  do {
    pTVar1 = *(Ticks **)((long)&buffer->info_range[0].begin + lVar2);
    if (*(Ticks **)((long)&buffer->info_range[0].end + lVar2) != pTVar1) {
      return *pTVar1;
    }
    lVar2 = lVar2 + 0x10;
  } while (lVar2 == 0x10);
  return 0xffffffffffffffff;
}

Assistant:

Ticks rewind_get_newest_ticks(RewindBuffer* buffer) {
  RewindInfoRange* info_range = buffer->info_range;

  int i;
  for (i = 0; i < 2; ++i) {
    if (!is_rewind_range_empty(&info_range[i])) {
      return info_range[i].begin[0].ticks;
    }
  }

  return INVALID_TICKS;
}